

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  addrinfo *paVar1;
  __type _Var2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  ssize_t sVar7;
  long lVar8;
  addrinfo **__pai;
  char local_2f8 [8];
  char userInput [256];
  char buf [256];
  char local_c8 [8];
  char s [46];
  pollfd local_78;
  pollfd pollData [2];
  addrinfo *local_60;
  addrinfo *servinfo;
  string sUserInput;
  
  if (argc != 2) {
    poVar5 = std::operator<<((ostream *)&std::cerr,"usage: client hostname");
    std::endl<char,std::char_traits<char>>(poVar5);
LAB_00102669:
    exit(1);
  }
  buf[0xf8] = '\0';
  buf[0xf9] = '\0';
  buf[0xfa] = '\0';
  buf[0xfb] = '\0';
  buf[0xfc] = '\0';
  buf[0xfd] = '\0';
  buf[0xfe] = '\0';
  buf[0xff] = '\0';
  __pai = &local_60;
  iVar3 = getaddrinfo(argv[1],"3491",(addrinfo *)(buf + 0xf8),__pai);
  if (iVar3 == 0) {
    while (paVar1 = *__pai, paVar1 != (addrinfo *)0x0) {
      iVar3 = socket(paVar1->ai_family,paVar1->ai_socktype,paVar1->ai_protocol);
      pcVar6 = "client: socket";
      if (iVar3 != -1) {
        iVar4 = connect(iVar3,paVar1->ai_addr,paVar1->ai_addrlen);
        if (iVar4 != -1) {
          inet_ntop(paVar1->ai_family,
                    paVar1->ai_addr->sa_data + (ulong)(paVar1->ai_addr->sa_family != 2) * 4 + 2,
                    local_c8,0x2e);
          freeaddrinfo(local_60);
          poVar5 = std::operator<<((ostream *)&std::cout,"My chat room server. Version Two.");
          std::endl<char,std::char_traits<char>>(poVar5);
          local_78.events = 1;
          local_78.fd = iVar3;
          pollData[0].fd = fileno(_stdin);
          pollData[0].events = 1;
          while( true ) {
            while( true ) {
              while( true ) {
                do {
                  iVar4 = poll(&local_78,2,500);
                } while (iVar4 == 0);
                if (iVar4 != -1) break;
                perror("Polling error");
              }
              if (((byte)local_78.revents & 1) != 0) break;
              servinfo = (addrinfo *)&sUserInput._M_string_length;
              sUserInput._M_dataplus._M_p = (pointer)0x0;
              sUserInput._M_string_length._0_1_ = 0;
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&std::cin,(string *)&servinfo);
              strcpy(local_2f8,(char *)servinfo);
              sVar7 = send(iVar3,local_2f8,0x100,0);
              __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (s + 0x28);
              if (sVar7 == -1) {
                perror("send");
              }
              std::__cxx11::string::string
                        ((string *)__rhs,"logout",
                         (allocator *)(sUserInput.field_2._M_local_buf + 0xf));
              _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&servinfo,__rhs);
              std::__cxx11::string::~string((string *)__rhs);
              if (_Var2) {
                std::__cxx11::string::~string((string *)&servinfo);
                close(iVar3);
                return 0;
              }
              lVar8 = std::__cxx11::string::find((char *)&servinfo,0x10309f);
              if (lVar8 != -1) {
                std::operator<<((ostream *)&std::cout,"> ");
                std::ostream::flush();
              }
              std::__cxx11::string::~string((string *)&servinfo);
            }
            bzero(userInput + 0xf8,0x100);
            sVar7 = recv(iVar3,userInput + 0xf8,0xff,0);
            iVar4 = (int)sVar7;
            if (iVar4 == -1) break;
            userInput[(long)iVar4 + 0xf8] = '\0';
            if (0 < iVar4) {
              poVar5 = std::operator<<((ostream *)&std::cout,userInput + 0xf8);
              poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
              std::operator<<(poVar5,"> ");
              std::ostream::flush();
            }
          }
          perror("recv");
          goto LAB_00102669;
        }
        close(iVar3);
        pcVar6 = "client: connect";
      }
      perror(pcVar6);
      __pai = &paVar1->ai_next;
    }
    poVar5 = std::operator<<((ostream *)&std::cerr,"client: failed to connect");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar3 = 2;
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,"getaddrinfo: ");
    pcVar6 = gai_strerror(iVar3);
    poVar5 = std::operator<<(poVar5,pcVar6);
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

int main(int argc, char *argv[]){
    //lots of declaration with the socket code
    int sockfd, numbytes;
    char buf[MAXDATASIZE];
    struct addrinfo hints, *servinfo, *p;
    int rv;
    char s[INET6_ADDRSTRLEN];
    char userInput[MAXDATASIZE];
    struct pollfd pollData[2];


    if (argc != 2) {
        cerr << "usage: client hostname" << endl;
        exit(1);
    }

    memset(&hints, 0, sizeof hints);

    //Accpets both IPV4 and IPV6
    hints.ai_family = AF_UNSPEC;
    //Using the stream socket type
    hints.ai_socktype = SOCK_STREAM;

    if ((rv = getaddrinfo(argv[1], PORT, &hints, &servinfo)) != 0) {
        cerr << "getaddrinfo: " <<  gai_strerror(rv) << endl;
        return 1;
    }

    // loop through all the results and connect to the first we can
    for(p = servinfo; p != NULL; p = p->ai_next) {
        if ((sockfd = socket(p->ai_family, p->ai_socktype,
                p->ai_protocol)) == -1) {
            perror("client: socket");
            continue;
        }
        //connect to that socket
        if (connect(sockfd, p->ai_addr, p->ai_addrlen) == -1) {
            close(sockfd);
            perror("client: connect");
            continue;
        }

        break;
    }

    if (p == NULL) {
        cerr << "client: failed to connect" << endl;
        return 2;
    }

    //Convert the binary address to string, Thanks to http://beej.us/guide/bgnet/output/html/multipage/clientserver.html
    // for the awsome function with all the bit operators, you da best
    inet_ntop(p->ai_family, get_in_addr((struct sockaddr *)p->ai_addr),
            s, sizeof s);
    //cout << "client: connecting to " <<  s << endl;

    freeaddrinfo(servinfo); // all done with this structure
    cout << "My chat room server. Version Two." << endl;




    //set everything up for stdin and sockect recv polling
    pollData[0].fd = sockfd;
    pollData[0].events = POLLIN;
    pollData[1].fd = fileno(stdin);
    pollData[1].events = POLLIN;


    while(1){

        //TODO finish polling
        rv = poll(pollData, 2, 500);

        if(rv == -1){
            perror("Polling error");
        }
        //check if there was some data recieved on stdin or the socket
        else if (rv != 0){
            //check if it was received on the socket
            if (pollData[0].revents & POLLIN) {
                bzero(buf,MAXDATASIZE);
                if ((numbytes = recv(sockfd, buf, MAXDATASIZE-1, 0)) == -1) {
                    perror("recv");
                    exit(1);
                }

                //add the nul terminator to stop the string of data
                buf[numbytes] = '\0';

                //if recieved actual data print it otherwise ignore it
                if(numbytes > 0){
                    //print out the message received from the serveer
                    cout << buf << endl << "> ";
                    //the last > gets caught if you don't flush standard out
                    cout.flush();
                }
            }
            else{
                // check if the user is typing on the command line
                string sUserInput;
                getline(cin,sUserInput);

                //copy it to a cstring
                strcpy (userInput, sUserInput.c_str());

                //send the input to the server
                if (send(sockfd, userInput, MAXDATASIZE, 0) == -1)
                    perror("send");
                //check if the user wants to log out
                if(sUserInput == string("logout")){
                    break;
                }
                //use this to fixed a missing > for the output
                else if(sUserInput.find("send") !=  string::npos){
                    cout << "> ";
                    cout.flush();
                }
            }
        }

    }

    //close the socket
    close(sockfd);

    return 0;
}